

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

Float __thiscall
pbrt::DielectricInterfaceBxDF::PDF
          (DielectricInterfaceBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Float FVar22;
  undefined8 uVar23;
  undefined8 in_XMM0_Qb;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined8 in_XMM2_Qb;
  undefined1 auVar39 [16];
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dd;
  undefined1 auVar40 [16];
  Vector3f wm;
  Vector3f wm_00;
  undefined1 local_a8 [16];
  undefined1 local_88 [8];
  undefined8 uStack_80;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_38;
  undefined1 auVar18 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  local_a8._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  fVar16 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar23 = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_a8._4_4_ = in_XMM3_Db;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = in_XMM3_Dd;
  uStack_80 = in_XMM2_Qb;
  local_88 = (undefined1  [8])wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17 = _local_88;
  local_58 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_54 = wo.super_Tuple3<pbrt::Vector3,_float>.y;
  fStack_50 = (float)in_XMM0_Qb;
  fStack_4c = (float)((ulong)in_XMM0_Qb >> 0x20);
  auVar2 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                      ZEXT416((uint)(this->mfDistrib).alpha_x));
  if (auVar2._0_4_ < 0.001) {
    return 0.0;
  }
  auVar2._8_4_ = fStack_50;
  auVar2._0_8_ = uVar23;
  auVar2._12_4_ = fStack_4c;
  auVar2 = vmovshdup_avx(auVar2);
  local_88._4_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_80._0_4_ = (float)in_XMM2_Qb;
  uStack_80._4_4_ = (float)((ulong)in_XMM2_Qb >> 0x20);
  fVar14 = wi.super_Tuple3<pbrt::Vector3,_float>.x;
  local_38 = auVar2._0_4_;
  if ((float)local_a8._0_4_ * fVar16 <= 0.0) {
    if ((sampleFlags & Transmission) == Unset) {
      return 0.0;
    }
    fVar38 = this->eta;
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar12 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                      ::reg,CONCAT44(in_register_00000034,mode)), iVar12 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar16),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar13 = (float)((uint)bVar4 * (int)fVar38 + (uint)!bVar4 * (int)(1.0 / fVar38));
    auVar18._0_4_ = fVar13 * fVar14 + local_58;
    auVar18._4_4_ = fVar13 * (float)local_88._4_4_ + fStack_54;
    auVar18._8_4_ = fVar13 * (float)uStack_80 + fStack_50;
    auVar18._12_4_ = fVar13 * uStack_80._4_4_ + fStack_4c;
    auVar20._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar20._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar20._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar20._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar2 = vhaddps_avx(auVar20,auVar20);
    fVar38 = fVar13 * (float)local_a8._0_4_ + fVar16;
    *(long *)(in_FS_OFFSET + -0x70) = *(long *)(in_FS_OFFSET + -0x70) + 1;
    fVar15 = fVar38 * fVar38 + auVar2._0_4_;
    if ((fVar15 == 0.0) && (!NAN(fVar15))) {
      *(long *)(in_FS_OFFSET + -0x78) = *(long *)(in_FS_OFFSET + -0x78) + 1;
      return 0.0;
    }
    auVar2 = vmovshdup_avx(auVar17);
    if (fVar15 < 0.0) {
      fVar15 = sqrtf(fVar15);
    }
    else {
      auVar17 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
      fVar15 = auVar17._0_4_;
    }
    auVar17._4_4_ = fVar15;
    auVar17._0_4_ = fVar15;
    auVar17._8_4_ = fVar15;
    auVar17._12_4_ = fVar15;
    auVar17 = vdivps_avx(auVar18,auVar17);
    uVar1 = auVar17._0_8_;
    auVar20 = vmovshdup_avx(auVar17);
    fVar38 = fVar38 / fVar15;
    auVar34 = ZEXT416((uint)fVar38);
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar2._0_4_ * auVar20._0_4_)),auVar17,
                             ZEXT416((uint)fVar14));
    auVar2 = vfmadd213ss_fma(local_a8,auVar34,auVar2);
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * local_38)),auVar17,
                              ZEXT416((uint)local_58));
    auVar18 = vfmadd231ss_fma(auVar18,auVar34,ZEXT416((uint)fVar16));
    if (0.0 < auVar2._0_4_ * auVar18._0_4_) {
      return 0.0;
    }
    auVar29 = ZEXT816(0) << 0x40;
    auVar20 = vfmadd213ss_fma(auVar20,auVar29,auVar34);
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ + (fVar38 - fVar38))),auVar29,auVar17);
    if (auVar20._0_4_ < 0.0) {
      auVar34._0_8_ = uVar1 ^ 0x8000000080000000;
      auVar34._8_4_ = auVar17._8_4_ ^ 0x80000000;
      auVar34._12_4_ = auVar17._12_4_ ^ 0x80000000;
      auVar17 = auVar34;
    }
    uVar3 = vcmpss_avx512f(auVar20,auVar29,1);
    bVar4 = (bool)((byte)uVar3 & 1);
    auVar11._8_4_ = fStack_50;
    auVar11._0_8_ = uVar23;
    auVar11._12_4_ = fStack_4c;
    auVar28._0_4_ = auVar17._0_4_ * local_58;
    auVar28._4_4_ = auVar17._4_4_ * fStack_54;
    auVar28._8_4_ = auVar17._8_4_ * fStack_50;
    auVar28._12_4_ = auVar17._12_4_ * fStack_4c;
    auVar20 = vmovshdup_avx(auVar28);
    auVar17 = vfmadd231ss_fma(auVar20,auVar17,auVar11);
    auVar20 = vfmadd231ss_fma(auVar17,ZEXT416((uint)bVar4 * (int)-fVar38 +
                                              (uint)!bVar4 * (int)fVar38),ZEXT416((uint)fVar16));
    bVar8 = auVar20._0_4_ < -1.0;
    auVar34 = SUB6416(ZEXT464(0x3f800000),0);
    auVar17 = vminss_avx(auVar34,auVar20);
    fVar16 = (float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar17._0_4_);
    bVar9 = 0.0 < fVar16;
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    auVar17 = vandps_avx512vl(auVar20,auVar6);
    uVar23 = vcmpss_avx512f(auVar34,auVar20,1);
    bVar4 = (bool)((byte)uVar23 & 1);
    auVar21._4_12_ = auVar17._4_12_;
    fVar14 = (float)((uint)bVar9 * (int)this->eta + (uint)!bVar9 * (int)(1.0 / this->eta));
    auVar20 = ZEXT416((uint)fVar14);
    auVar21._0_4_ =
         (uint)bVar9 * (int)fVar16 +
         (uint)!bVar9 *
         ((uint)bVar8 * 0x3f800000 +
         (uint)!bVar8 * ((uint)bVar4 * 0x3f800000 + (uint)!bVar4 * auVar17._0_4_));
    auVar17 = vfnmadd213ss_fma(auVar21,auVar21,auVar34);
    auVar17 = vmaxss_avx(auVar17,auVar29);
    if (auVar17._0_4_ < 0.0) {
      auVar32._0_4_ = sqrtf(auVar17._0_4_);
      auVar32._4_60_ = extraout_var_01;
      auVar17 = auVar32._0_16_;
    }
    else {
      auVar17 = vsqrtss_avx(auVar17,auVar17);
    }
    auVar29._0_4_ = auVar17._0_4_ / fVar14;
    auVar29._4_12_ = auVar17._4_12_;
    fVar16 = 1.0;
    if (auVar29._0_4_ < 1.0) {
      auVar17 = vfnmadd213ss_fma(auVar29,auVar29,ZEXT416(0x3f800000));
      auVar17 = vmaxss_avx(auVar17,ZEXT816(0) << 0x20);
      if (auVar17._0_4_ < 0.0) {
        auVar33._0_4_ = sqrtf(auVar17._0_4_);
        auVar33._4_60_ = extraout_var_02;
        auVar17 = auVar33._0_16_;
      }
      else {
        auVar17 = vsqrtss_avx(auVar17,auVar17);
      }
      auVar29 = vfmsub213ss_fma(auVar21,auVar20,auVar17);
      auVar34 = vfmadd213ss_fma(auVar21,auVar20,auVar17);
      auVar37._0_4_ = auVar29._0_4_ / auVar34._0_4_;
      auVar37._4_12_ = auVar29._4_12_;
      auVar34 = vfnmadd213ss_fma(auVar17,auVar20,auVar21);
      auVar17 = vfmadd213ss_fma(auVar17,auVar20,auVar21);
      fVar16 = auVar34._0_4_ / auVar17._0_4_;
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar16)),auVar37,auVar37);
      fVar16 = auVar17._0_4_ * 0.5;
    }
    local_a8._0_4_ = 1.0 - fVar16;
    if (((float)local_a8._0_4_ == 0.0) && (!NAN((float)local_a8._0_4_))) {
      return 0.0;
    }
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar12 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                      ::reg), iVar12 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(in_FS_OFFSET + -0x60) = *(long *)(in_FS_OFFSET + -0x60) + 1;
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar17 = vandps_avx512vl(auVar2,auVar7);
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)auVar18._0_4_),auVar2,ZEXT416((uint)fVar13));
    wm_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar38;
    wm_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
    wm_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar1 >> 0x20);
    FVar22 = TrowbridgeReitzDistribution::PDF(&this->mfDistrib,wo,wm_00);
    fVar14 = (float)local_a8._0_4_ * FVar22 * (auVar17._0_4_ / (auVar2._0_4_ * auVar2._0_4_));
    local_a8._0_4_ = (float)local_a8._0_4_ + (float)((uint)((byte)sampleFlags & 1) * (int)fVar16);
  }
  else {
    if ((sampleFlags & Reflection) == Unset) {
      return 0.0;
    }
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar12 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                      ::reg,CONCAT44(in_register_00000034,mode)), iVar12 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    local_68._0_4_ = fVar14 + local_58;
    local_68._4_4_ = (float)local_88._4_4_ + fStack_54;
    fStack_60 = (float)uStack_80 + fStack_50;
    fStack_5c = uStack_80._4_4_ + fStack_4c;
    fVar38 = (float)local_a8._0_4_ + fVar16;
    auVar24._0_4_ = (float)local_68._0_4_ * (float)local_68._0_4_;
    auVar24._4_4_ = (float)local_68._4_4_ * (float)local_68._4_4_;
    auVar24._8_4_ = fStack_60 * fStack_60;
    auVar24._12_4_ = fStack_5c * fStack_5c;
    auVar2 = vhaddps_avx(auVar24,auVar24);
    *(long *)(in_FS_OFFSET + -0xa0) = *(long *)(in_FS_OFFSET + -0xa0) + 1;
    fVar15 = fVar38 * fVar38 + auVar2._0_4_;
    if ((fVar15 == 0.0) && (!NAN(fVar15))) {
      *(long *)(in_FS_OFFSET + -0xa8) = *(long *)(in_FS_OFFSET + -0xa8) + 1;
    }
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar12 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                      ::reg), iVar12 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(in_FS_OFFSET + -0x90) = *(long *)(in_FS_OFFSET + -0x90) + 1;
    auVar10._8_4_ = fStack_50;
    auVar10._0_8_ = uVar23;
    auVar10._12_4_ = fStack_4c;
    auVar25._0_4_ = (float)local_68._0_4_ * local_58;
    auVar25._4_4_ = (float)local_68._4_4_ * fStack_54;
    auVar25._8_4_ = fStack_60 * fStack_50;
    auVar25._12_4_ = fStack_5c * fStack_4c;
    auVar2 = vmovshdup_avx(auVar25);
    auVar2 = vfmadd231ss_fma(auVar2,auVar10,_local_68);
    auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)fVar38),ZEXT416((uint)fVar16));
    if (auVar2._0_4_ < 0.0) {
      *(long *)(in_FS_OFFSET + -0x98) = *(long *)(in_FS_OFFSET + -0x98) + 1;
    }
    if ((fVar15 == 0.0) && (!NAN(fVar15))) {
      return 0.0;
    }
    if (auVar2._0_4_ <= 0.0) {
      return 0.0;
    }
    if (fVar15 < 0.0) {
      fVar15 = sqrtf(fVar15);
    }
    else {
      auVar2 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
      fVar15 = auVar2._0_4_;
    }
    fVar38 = fVar38 / fVar15;
    auVar26._4_4_ = fVar15;
    auVar26._0_4_ = fVar15;
    auVar26._8_4_ = fVar15;
    auVar26._12_4_ = fVar15;
    auVar2 = vdivps_avx(_local_68,auVar26);
    auVar20 = vmovshdup_avx(auVar2);
    auVar34 = ZEXT816(0) << 0x20;
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 0.0)),auVar2,auVar34);
    fVar15 = fVar38 + auVar18._0_4_;
    uVar1 = auVar2._0_8_;
    auVar40 = auVar2;
    if (fVar15 < 0.0) {
      auVar40._0_8_ = uVar1 ^ 0x8000000080000000;
      auVar40._8_4_ = auVar2._8_4_ ^ 0x80000000;
      auVar40._12_4_ = auVar2._12_4_ ^ 0x80000000;
    }
    uVar23 = vcmpss_avx512f(ZEXT416((uint)fVar15),auVar34,1);
    bVar4 = (bool)((byte)uVar23 & 1);
    auVar39._0_4_ = auVar40._0_4_ * fVar14;
    auVar39._4_4_ = auVar40._4_4_ * (float)local_88._4_4_;
    auVar39._8_4_ = auVar40._8_4_ * (float)uStack_80;
    auVar39._12_4_ = auVar40._12_4_ * uStack_80._4_4_;
    auVar18 = vmovshdup_avx(auVar39);
    auVar17 = vfmadd231ss_fma(auVar18,auVar40,auVar17);
    auVar18 = vfmadd231ss_fma(auVar17,ZEXT416((uint)bVar4 * (int)-fVar38 +
                                              (uint)!bVar4 * (int)fVar38),
                              ZEXT416((uint)local_a8._0_4_));
    bVar8 = auVar18._0_4_ < -1.0;
    local_a8 = SUB6416(ZEXT464(0x3f800000),0);
    auVar17 = vminss_avx(local_a8,auVar18);
    fVar14 = (float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar17._0_4_);
    bVar9 = 0.0 < fVar14;
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar17 = vandps_avx512vl(auVar18,auVar5);
    uVar23 = vcmpss_avx512f(local_a8,auVar18,1);
    bVar4 = (bool)((byte)uVar23 & 1);
    auVar19._4_12_ = auVar17._4_12_;
    fVar15 = (float)((uint)bVar9 * (int)this->eta + (uint)!bVar9 * (int)(1.0 / this->eta));
    auVar18 = ZEXT416((uint)fVar15);
    auVar19._0_4_ =
         (uint)bVar9 * (int)fVar14 +
         (uint)!bVar9 *
         ((uint)bVar8 * 0x3f800000 +
         (uint)!bVar8 * ((uint)bVar4 * 0x3f800000 + (uint)!bVar4 * auVar17._0_4_));
    auVar17 = vfnmadd213ss_fma(auVar19,auVar19,local_a8);
    auVar17 = vmaxss_avx(auVar17,auVar34);
    if (auVar17._0_4_ < 0.0) {
      auVar30._0_4_ = sqrtf(auVar17._0_4_);
      auVar30._4_60_ = extraout_var;
      auVar17 = auVar30._0_16_;
    }
    else {
      auVar17 = vsqrtss_avx(auVar17,auVar17);
    }
    auVar27._0_4_ = auVar17._0_4_ / fVar15;
    auVar27._4_12_ = auVar17._4_12_;
    if (auVar27._0_4_ < 1.0) {
      auVar17 = vfnmadd213ss_fma(auVar27,auVar27,ZEXT416(0x3f800000));
      auVar35._0_12_ = ZEXT812(0);
      auVar35._12_4_ = 0;
      auVar17 = vmaxss_avx(auVar17,auVar35);
      if (auVar17._0_4_ < 0.0) {
        auVar31._0_4_ = sqrtf(auVar17._0_4_);
        auVar31._4_60_ = extraout_var_00;
        auVar17 = auVar31._0_16_;
      }
      else {
        auVar17 = vsqrtss_avx(auVar17,auVar17);
      }
      auVar29 = vfmsub213ss_fma(auVar19,auVar18,auVar17);
      auVar34 = vfmadd213ss_fma(auVar19,auVar18,auVar17);
      auVar36._0_4_ = auVar29._0_4_ / auVar34._0_4_;
      auVar36._4_12_ = auVar29._4_12_;
      auVar34 = vfnmadd213ss_fma(auVar17,auVar18,auVar19);
      auVar17 = vfmadd213ss_fma(auVar17,auVar18,auVar19);
      fVar14 = auVar34._0_4_ / auVar17._0_4_;
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar14)),auVar36,auVar36);
      local_a8 = ZEXT416((uint)(auVar17._0_4_ * 0.5));
    }
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar12 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                      ::reg), iVar12 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(in_FS_OFFSET + -0x80) = *(long *)(in_FS_OFFSET + -0x80) + 1;
    if (((float)local_a8._0_4_ == 0.0) && (!NAN((float)local_a8._0_4_))) {
      *(long *)(in_FS_OFFSET + -0x88) = *(long *)(in_FS_OFFSET + -0x88) + 1;
    }
    wm.super_Tuple3<pbrt::Vector3,_float>.z = fVar38;
    wm.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
    wm.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar1 >> 0x20);
    FVar22 = TrowbridgeReitzDistribution::PDF(&this->mfDistrib,wo,wm);
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * local_38)),auVar2,
                             ZEXT416((uint)local_58));
    auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)fVar38),ZEXT416((uint)fVar16));
    fVar14 = (float)local_a8._0_4_ * (FVar22 / (auVar2._0_4_ * 4.0));
    local_a8._0_4_ =
         (float)local_a8._0_4_ +
         (float)((uint)((sampleFlags & Transmission) != Unset) * (int)(1.0 - (float)local_a8._0_4_))
    ;
  }
  return fVar14 / (float)local_a8._0_4_;
}

Assistant:

Float DielectricInterfaceBxDF::PDF(Vector3f wo, Vector3f wi, TransportMode mode,
                                   BxDFReflTransFlags sampleFlags) const {
    if (mfDistrib.EffectivelySmooth())
        return 0;
    // Return PDF for non-delta dielectric interface
    if (SameHemisphere(wo, wi)) {
        // Return PDF for non-delta dielectric reflection
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return 0;
        // Compute half-angle vector _wh_ for dielectric reflection PDF
        Vector3f wh = wo + wi;
        CHECK_RARE(1e-5f, LengthSquared(wh) == 0);
        CHECK_RARE(1e-5f, Dot(wo, wh) < 0);
        if (LengthSquared(wh) == 0 || Dot(wo, wh) <= 0)
            return 0;
        wh = Normalize(wh);

        // Compute Fresnel factor and probabilities for dielectric reflection PDF
        Float F = FrDielectric(Dot(wi, FaceForward(wh, Vector3f(0, 0, 1))), eta);
        CHECK_RARE(1e-5f, F == 0);
        Float pr = F, pt = 1 - F;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;

        return mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh)) * pr / (pr + pt);

    } else {
        // Return PDF for non-delta dielectric transmission
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            return 0;
        // Compute $\wh$ for dielectric transmission PDF
        Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
        Vector3f wh = wo + wi * etap;
        CHECK_RARE(1e-5f, LengthSquared(wh) == 0);
        if (LengthSquared(wh) == 0)
            return 0;
        wh = Normalize(wh);
        if (Dot(wi, wh) * Dot(wo, wh) > 0)
            return 0.;

        // Compute Fresnel factor and probabilities for dielectric transmission PDF
        Float F = FrDielectric(Dot(wo, FaceForward(wh, Normal3f(0, 0, 1))), eta);
        Float pr = F, pt = 1 - F;
        if (pt == 0)
            return 0;
        CHECK_RARE(1e-5f, (1 - F) == 0);
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;

        Float dwh_dwi = AbsDot(wi, wh) / Sqr(Dot(wo, wh) + etap * Dot(wi, wh));
        return mfDistrib.PDF(wo, wh) * dwh_dwi * pt / (pr + pt);
    }
}